

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O0

void __thiscall bdHashSet::bdHashSet(bdHashSet *this,bdNodeId *id)

{
  bdNodeId *id_local;
  bdHashSet *this_local;
  
  *(undefined8 *)(this->mId).data = *(undefined8 *)id->data;
  *(undefined8 *)((this->mId).data + 8) = *(undefined8 *)(id->data + 8);
  *(undefined4 *)((this->mId).data + 0x10) = *(undefined4 *)(id->data + 0x10);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
  ::multimap(&this->mEntries);
  return;
}

Assistant:

bdHashSet::bdHashSet(bdNodeId *id)
	:mId(*id) {
	return;
}